

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uECC.c
# Opt level: O3

bitcount_t uECC_vli_numBits(uECC_word_t *vli,wordcount_t max_words)

{
  ulong uVar1;
  long lVar2;
  char cVar3;
  byte bVar4;
  uint uVar5;
  short sVar6;
  uint uVar7;
  
  uVar7 = (uint)(byte)max_words;
  uVar5 = uVar7 + 1;
  cVar3 = -1;
  if ((char)(max_words + -1) < -1) {
    cVar3 = max_words + -1;
  }
  do {
    uVar7 = uVar7 - 1;
    bVar4 = cVar3 + 1;
    if ((char)uVar7 < '\0') break;
    bVar4 = (char)uVar5 - 1;
    uVar5 = (uint)bVar4;
  } while (vli[uVar7 & 0x7f] == 0);
  sVar6 = 0;
  if (bVar4 != 0) {
    uVar1 = vli[(long)(char)bVar4 + -1];
    lVar2 = 0x3f;
    if (uVar1 != 0) {
      for (; uVar1 >> lVar2 == 0; lVar2 = lVar2 + -1) {
      }
    }
    sVar6 = ((ushort)lVar2 ^ 0xffc0) + 0x41;
    if (uVar1 == 0) {
      sVar6 = 0;
    }
    sVar6 = (char)bVar4 * 0x40 + sVar6 + -0x40;
  }
  return sVar6;
}

Assistant:

uECC_VLI_API bitcount_t uECC_vli_numBits(const uECC_word_t *vli, const wordcount_t max_words) {
    uECC_word_t i;
    uECC_word_t digit;

    wordcount_t num_digits = vli_numDigits(vli, max_words);
    if (num_digits == 0) {
        return 0;
    }

    digit = vli[num_digits - 1];
    for (i = 0; digit; ++i) {
        digit >>= 1;
    }

    return (((bitcount_t)(num_digits - 1) << uECC_WORD_BITS_SHIFT) + i);
}